

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint64Test_NonCanonicalZero_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint64Test_NonCanonicalZero_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  google::protobuf::internal::anon_unknown_0::ShiftMixParseVarint64Test::ShiftMixParseVarint64Test
            ((ShiftMixParseVarint64Test *)this_00);
  (((TestWithParam<int> *)&this_00->_vptr_Test)->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestWithParam_01640768;
  this_00[1]._vptr_Test =
       (_func_int **)&PTR__ShiftMixParseVarint64Test_NonCanonicalZero_Test_016407a8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }